

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_random_in_range_fn(mp_int *lo,mp_int *hi,random_read_fn_t rf)

{
  mp_int *limit;
  mp_int *a;
  mp_int *pmVar1;
  
  limit = mp_sub(hi,lo);
  a = mp_random_upto_fn(limit,rf);
  pmVar1 = mp_make_sized(hi->nw);
  mp_add_masked_into(pmVar1->w,pmVar1->nw,a,lo,0xffffffffffffffff,0,0);
  mp_free(a);
  mp_free(limit);
  return pmVar1;
}

Assistant:

mp_int *mp_random_in_range_fn(mp_int *lo, mp_int *hi, random_read_fn_t rf)
{
    mp_int *n_outcomes = mp_sub(hi, lo);
    mp_int *addend = mp_random_upto_fn(n_outcomes, rf);
    mp_int *result = mp_make_sized(hi->nw);
    mp_add_into(result, addend, lo);
    mp_free(addend);
    mp_free(n_outcomes);
    return result;
}